

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void __thiscall AActor::UpdateRenderSectorList(AActor *this)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  FPortalBlock *pFVar5;
  FLinePortal *s;
  portnode_t *ppVar6;
  msecnode_t *pmVar7;
  double y;
  double radius;
  double dVar8;
  bool local_181;
  undefined1 local_170 [40];
  TVector3<double> local_148;
  undefined1 local_130 [8];
  DVector2 newpos_1;
  double planeh_1;
  DVector3 local_108;
  TVector3<double> local_f0;
  undefined1 local_d8 [8];
  DVector2 newpos;
  double planeh;
  double lasth;
  sector_t *sec;
  FLinePortal *p;
  iterator __end4;
  iterator __begin4;
  TArray<FLinePortal,_FLinePortal> *__range4;
  FBoundingBox bb;
  int by;
  int bx;
  DVector3 local_58;
  undefined1 local_40 [20];
  TFlags<ActorFlag,_unsigned_int> local_2c;
  DVector3 local_28;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 local_10;
  AActor *this_local;
  
  local_10.p = this;
  Pos(&local_28,this);
  bVar1 = TVector3<double>::operator!=(&local_28,&this->OldRenderPos);
  bVar2 = false;
  if (bVar1) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_2c,(int)this + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
    bVar2 = uVar3 == 0;
  }
  if (bVar2) {
    ClearRenderLineList(this);
    local_181 = false;
    if ((PortalBlockmap.containsLines & 1U) != 0) {
      Pos(&local_58,this);
      TVector3<double>::XY((TVector3<double> *)local_40);
      TVector3<double>::XY((TVector3<double> *)&by);
      local_181 = TVector2<double>::operator!=((TVector2<double> *)local_40,(TVector2<double> *)&by)
      ;
    }
    if (local_181 != false) {
      dVar8 = X(this);
      bb.m_Box[3]._4_4_ = GetBlockX(dVar8);
      dVar8 = Y(this);
      bb.m_Box[3]._0_4_ = GetBlockY(dVar8);
      dVar8 = X(this);
      y = Y(this);
      radius = MIN<double>(this->radius * 1.5,128.0);
      FBoundingBox::FBoundingBox((FBoundingBox *)&__range4,dVar8,y,radius);
      if ((((-1 < bb.m_Box[3]._4_4_) && (-1 < bb.m_Box[3]._0_4_)) && (bb.m_Box[3]._4_4_ < bmapwidth)
          ) && ((bb.m_Box[3]._0_4_ < bmapheight &&
                (pFVar5 = FPortalBlockmap::operator()
                                    (&PortalBlockmap,bb.m_Box[3]._4_4_,bb.m_Box[3]._0_4_),
                (pFVar5->neighborContainsLines & 1U) != 0)))) {
        __end4 = TArray<FLinePortal,_FLinePortal>::begin(&linePortals);
        p = (FLinePortal *)TArray<FLinePortal,_FLinePortal>::end(&linePortals);
        while (bVar2 = TIterator<FLinePortal>::operator!=(&__end4,(TIterator<FLinePortal> *)&p),
              bVar2) {
          s = TIterator<FLinePortal>::operator*(&__end4);
          if (((s->mType != '\0') &&
              (bVar2 = FBoundingBox::inRange((FBoundingBox *)&__range4,s->mOrigin), bVar2)) &&
             (iVar4 = FBoundingBox::BoxOnLineSide((FBoundingBox *)&__range4,s->mOrigin), iVar4 != 0)
             ) {
            ppVar6 = P_AddPortalnode(s,this,this->render_portallist);
            this->render_portallist = ppVar6;
          }
          TIterator<FLinePortal>::operator++(&__end4);
        }
      }
    }
    lasth = (double)this->Sector;
    planeh = -3.4028234663852886e+38;
    ClearRenderSectorList(this);
    while (((bVar2 = sector_t::PortalBlocksMovement((sector_t *)lasth,1), ((bVar2 ^ 0xffU) & 1) != 0
            && (newpos.Y = sector_t::GetPortalPlaneZ((sector_t *)lasth,1), planeh < newpos.Y)) &&
           (dVar8 = Top(this), newpos.Y <= dVar8 + 64.0))) {
      planeh = newpos.Y;
      Pos(&local_108,this);
      sector_t::GetPortalDisplacement((sector_t *)&planeh_1,SUB84(lasth,0));
      operator+(&local_f0,&local_108,(Vector2 *)&planeh_1);
      TVector2<double>::TVector2((TVector2<double> *)local_d8,&local_f0);
      lasth = (double)P_PointInSector((DVector2 *)local_d8);
      pmVar7 = P_AddSecnode((sector_t *)lasth,this,this->render_sectorlist,
                            &((sector_t *)lasth)->render_thinglist);
      this->render_sectorlist = pmVar7;
    }
    planeh = 3.4028234663852886e+38;
    while (((bVar2 = sector_t::PortalBlocksMovement((sector_t *)lasth,0), ((bVar2 ^ 0xffU) & 1) != 0
            && (newpos_1.Y = sector_t::GetPortalPlaneZ((sector_t *)lasth,0), newpos_1.Y < planeh))
           && (dVar8 = Z(this), dVar8 - 64.0 <= newpos_1.Y))) {
      planeh = newpos_1.Y;
      Pos((DVector3 *)(local_170 + 0x10),this);
      sector_t::GetPortalDisplacement((sector_t *)local_170,SUB84(lasth,0));
      operator+(&local_148,(TVector3<double> *)(local_170 + 0x10),(Vector2 *)local_170);
      TVector2<double>::TVector2((TVector2<double> *)local_130,&local_148);
      lasth = (double)P_PointInSector((DVector2 *)local_130);
      pmVar7 = P_AddSecnode((sector_t *)lasth,this,this->render_sectorlist,
                            &((sector_t *)lasth)->render_thinglist);
      this->render_sectorlist = pmVar7;
    }
  }
  return;
}

Assistant:

void AActor::UpdateRenderSectorList()
{
	static const double SPRITE_SPACE = 64.;
	if (Pos() != OldRenderPos && !(flags & MF_NOSECTOR))
	{
		// Only check if the map contains line portals
		ClearRenderLineList();
		if (PortalBlockmap.containsLines && Pos().XY() != OldRenderPos.XY())
		{
			int bx = GetBlockX(X());
			int by = GetBlockY(Y());
			FBoundingBox bb(X(), Y(), MIN(radius*1.5, 128.));	// Don't go further than 128 map units, even for large actors
			// Are there any portals near the actor's position?
			if (bx >= 0 && by >= 0 && bx < bmapwidth && by < bmapheight && PortalBlockmap(bx, by).neighborContainsLines)
			{
				// Go through the entire list. In most cases this is faster than setting up a blockmap iterator
				for (auto &p : linePortals)
				{
					if (p.mType == PORTT_VISUAL) continue;
					if (bb.inRange(p.mOrigin) && bb.BoxOnLineSide(p.mOrigin))
					{
						render_portallist = P_AddPortalnode(&p, this, render_portallist);
					}
				}
			}
		}
		sector_t *sec = Sector;
		double lasth = -FLT_MAX;
		ClearRenderSectorList();
		while (!sec->PortalBlocksMovement(sector_t::ceiling))
		{
			double planeh = sec->GetPortalPlaneZ(sector_t::ceiling);
			if (planeh <= lasth) break;	// broken setup.
			if (Top() + SPRITE_SPACE < planeh) break;
			lasth = planeh;
			DVector2 newpos = Pos() + sec->GetPortalDisplacement(sector_t::ceiling);
			sec = P_PointInSector(newpos);
			render_sectorlist = P_AddSecnode(sec, this, render_sectorlist, sec->render_thinglist);
		}
		lasth = FLT_MAX;
		while (!sec->PortalBlocksMovement(sector_t::floor))
		{
			double planeh = sec->GetPortalPlaneZ(sector_t::floor);
			if (planeh >= lasth) break;	// broken setup.
			if (Z() - SPRITE_SPACE > planeh) break;
			lasth = planeh;
			DVector2 newpos = Pos() + sec->GetPortalDisplacement(sector_t::floor);
			sec = P_PointInSector(newpos);
			render_sectorlist = P_AddSecnode(sec, this, render_sectorlist, sec->render_thinglist);
		}
	}
}